

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall
spvtools::opt::CFG::ForEachBlockInReversePostOrder
          (CFG *this,BasicBlock *bb,function<void_(spvtools::opt::BasicBlock_*)> *f)

{
  function<void_(spvtools::opt::BasicBlock_*)> *this_00;
  _Any_data _Stack_68;
  _Manager_type local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  std::function<void_(spvtools::opt::BasicBlock_*)>::function
            ((function<void_(spvtools::opt::BasicBlock_*)> *)&_Stack_68,f);
  local_48._8_8_ = 0;
  this_00 = (function<void_(spvtools::opt::BasicBlock_*)> *)::operator_new(0x20);
  std::function<void_(spvtools::opt::BasicBlock_*)>::function
            (this_00,(function<void_(spvtools::opt::BasicBlock_*)> *)&_Stack_68);
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:120:40)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:120:40)>
             ::_M_manager;
  local_48._M_unused._M_object = this_00;
  WhileEachBlockInReversePostOrder
            (this,bb,(function<bool_(spvtools::opt::BasicBlock_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  return;
}

Assistant:

void CFG::ForEachBlockInReversePostOrder(
    BasicBlock* bb, const std::function<void(BasicBlock*)>& f) {
  WhileEachBlockInReversePostOrder(bb, [f](BasicBlock* b) {
    f(b);
    return true;
  });
}